

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool ra_init_with_capacity(roaring_array_t *new_ra,uint32_t cap)

{
  void **ppvVar1;
  uint in_ESI;
  roaring_array_t *in_RDI;
  void *bigalloc;
  uint local_14;
  _Bool local_1;
  
  if (in_RDI == (roaring_array_t *)0x0) {
    local_1 = false;
  }
  else {
    ra_init(in_RDI);
    local_14 = in_ESI;
    if (0x10000 < in_ESI) {
      local_14 = 0x10000;
    }
    if (local_14 != 0) {
      ppvVar1 = (void **)roaring_malloc(0x110c1f);
      if (ppvVar1 == (void **)0x0) {
        return false;
      }
      in_RDI->containers = ppvVar1;
      in_RDI->keys = (uint16_t *)(in_RDI->containers + local_14);
      in_RDI->typecodes = (uint8_t *)(in_RDI->keys + local_14);
      in_RDI->allocation_size = local_14;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ra_init_with_capacity(roaring_array_t *new_ra, uint32_t cap) {
    if (!new_ra) return false;
    ra_init(new_ra);

    // Containers hold 64Ki elements, so 64Ki containers is enough to hold
    // `0x10000 * 0x10000` (all 2^32) elements
    if (cap > 0x10000) {
        cap = 0x10000;
    }

    if (cap > 0) {
        void *bigalloc = roaring_malloc(
            cap * (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t)));
        if (bigalloc == NULL) return false;
        new_ra->containers = (container_t **)bigalloc;
        new_ra->keys = (uint16_t *)(new_ra->containers + cap);
        new_ra->typecodes = (uint8_t *)(new_ra->keys + cap);
        // Narrowing is safe because of above check
        new_ra->allocation_size = (int32_t)cap;
    }
    return true;
}